

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

pair<int,_int> __thiscall libtorrent::aux::parse_utf8_codepoint(aux *this,string_view str)

{
  ulong uVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  pbVar8 = (byte *)str._M_len;
  if (this == (aux *)0x0) {
    pVar5.first = -1;
    pVar5.second = 0;
    return pVar5;
  }
  bVar9 = *pbVar8;
  uVar7 = 1;
  if (((((char)bVar9 < '\0') && (uVar7 = 2, (bVar9 & 0xe0) != 0xc0)) &&
      (uVar7 = 3, (bVar9 & 0xf0) != 0xe0)) && (uVar7 = 4, (bVar9 & 0xf8) != 0xf0)) {
    uVar7 = (ulong)((uint)((bVar9 & 0xfc) == 0xf8) * 5);
  }
  uVar6 = (uint)uVar7;
  if (uVar6 == 0) {
    pVar3.first = -1;
    pVar3.second = 1;
    return pVar3;
  }
  if (uVar6 == 1) {
    return (pair<int,_int>)((ulong)(uint)(int)(char)bVar9 | uVar7 << 0x20);
  }
  if (uVar6 < 5) {
    if ((int)this < (int)uVar6) {
      return (pair<int,_int>)((long)this << 0x20 | 0xffffffff);
    }
    pVar4.first = uVar6 - 1;
    pVar4.second = 0;
    if (pVar4.first < 4) {
      pVar5 = (pair<int,_int>)
              ((long)&switchD_00397438::switchdataD_003fefbc +
              (long)(int)(&switchD_00397438::switchdataD_003fefbc)[(long)pVar4]);
      switch(pVar4) {
      case (pair<int,_int>)0x0:
        bVar9 = bVar9 & 0x7f;
        break;
      case (pair<int,_int>)0x1:
        bVar9 = bVar9 & 0x1f;
        break;
      case (pair<int,_int>)0x2:
        bVar9 = bVar9 & 0xf;
        break;
      case (pair<int,_int>)0x3:
        bVar9 = bVar9 & 7;
      }
    }
    else {
      bVar9 = 0;
      pVar5 = pVar4;
    }
    bVar12 = 1 < uVar6;
    uVar10 = (uint)bVar9;
    if (bVar12) {
      pVar5 = (pair<int,_int>)(uVar7 << 0x20 | 0xffffffff);
      uVar10 = (uint)bVar9;
      if ((char)pbVar8[1] < -0x40) {
        uVar1 = 2;
        uVar2 = pbVar8[1] & 0x3f | (uint)bVar9 << 6;
        do {
          uVar10 = uVar2;
          uVar11 = uVar1;
          if (uVar7 == uVar11) break;
          uVar1 = uVar11 + 1;
          uVar2 = pbVar8[uVar11] & 0x3f | uVar10 << 6;
        } while ((char)pbVar8[uVar11] < -0x40);
        bVar12 = uVar11 < uVar7;
      }
    }
    if (bVar12) {
      return pVar5;
    }
    if (uVar6 == 4) {
      if ((int)uVar10 < 0x10000) goto LAB_0039740f;
    }
    else if (uVar6 == 3) {
      if ((int)uVar10 < 0x800) goto LAB_0039740f;
    }
    else if ((uVar6 == 2) && ((int)uVar10 < 0x80)) goto LAB_0039740f;
    if (((int)uVar10 < 0x110000) && ((uVar10 & 0xfffff800) != 0xd800)) {
      return (pair<int,_int>)(uVar7 << 0x20 | (ulong)uVar10);
    }
  }
LAB_0039740f:
  return (pair<int,_int>)(uVar7 << 0x20 | 0xffffffff);
}

Assistant:

std::pair<std::int32_t, int> parse_utf8_codepoint(string_view str)
	{
		TORRENT_ASSERT(!str.empty());
		if (str.empty()) return std::make_pair(-1, 0);

		int const sequence_len = utf8_sequence_length(str[0]);

		// this is likely the most common case
		if (sequence_len == 1) return std::make_pair(std::int32_t(str[0]), sequence_len);

		// if we find an invalid sequence length, skip one byte
		if (sequence_len == 0)
			return std::make_pair(-1, 1);

		if (sequence_len > 4)
			return std::make_pair(-1, sequence_len);

		if (sequence_len > int(str.size()))
			return std::make_pair(-1, static_cast<int>(str.size()));

		std::int32_t ch = 0;
		// first byte
		switch (sequence_len)
		{
			case 1:
				ch = str[0] & 0b01111111;
				break;
			case 2:
				ch = str[0] & 0b00011111;
				break;
			case 3:
				ch = str[0] & 0b00001111;
				break;
			case 4:
				ch = str[0] & 0b00000111;
				break;
		}
		for (int i = 1; i < sequence_len; ++i)
		{
			auto const b = static_cast<std::uint8_t>(str[static_cast<std::size_t>(i)]);
			// continuation bytes must start with 10xxxxxx
			if (b > 0b10111111 || b < 0b10000000)
				return std::make_pair(-1, sequence_len);
			ch <<= 6;
			ch += b & 0b111111;
		}

		// check if the sequence is overlong, i.e. whether it has leading
		// (redundant) zeros
		switch (sequence_len)
		{
			case 2:
				if (ch < 0x80) return std::make_pair(-1, sequence_len);
				break;
			case 3:
				if (ch < 0x800) return std::make_pair(-1, sequence_len);
				break;
			case 4:
				if (ch < 0x10000) return std::make_pair(-1, sequence_len);
				break;
		}

		if (ch > max_codepoint)
			return std::make_pair(-1, sequence_len);

		// per RFC 3629, surrogates should not appear in utf-8
		if (ch >= surrogate_start && ch <= surrogate_end)
			return std::make_pair(-1, sequence_len);

		return std::make_pair(static_cast<std::int32_t>(ch), sequence_len);
	}